

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O3

void __thiscall tcu::ThreadUtil::Object::~Object(Object *this)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  
  this->_vptr_Object = (_func_int **)&PTR__Object_003f2cf8;
  std::
  vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ::~vector(&this->m_reads);
  pSVar2 = (this->m_modify).m_state;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar2->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->m_modify).m_ptr = (Event *)0x0;
      (*((this->m_modify).m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->m_modify).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar2 = (this->m_modify).m_state;
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        (*pSVar2->_vptr_SharedPtrStateBase[1])();
      }
      (this->m_modify).m_state = (SharedPtrStateBase *)0x0;
    }
  }
  return;
}

Assistant:

Object::~Object	(void)
{
}